

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O0

void __thiscall TPZTensor<double>::CopyToTensor(TPZTensor<double> *this,TPZFMatrix<double> *Tensor)

{
  double dVar1;
  double *pdVar2;
  long *in_RSI;
  TPZFMatrix<double> *in_RDI;
  int64_t in_stack_ffffffffffffffd0;
  double dVar3;
  int64_t in_stack_ffffffffffffffd8;
  double row;
  
  (**(code **)(*in_RSI + 0x68))(in_RSI,3);
  pdVar2 = XX((TPZTensor<double> *)0x14aaf95);
  dVar3 = *pdVar2;
  pdVar2 = TPZFMatrix<double>::operator()
                     (in_RDI,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  *pdVar2 = dVar3;
  pdVar2 = XY((TPZTensor<double> *)0x14aafc2);
  dVar3 = *pdVar2;
  pdVar2 = TPZFMatrix<double>::operator()
                     (in_RDI,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  *pdVar2 = dVar3;
  pdVar2 = TPZFMatrix<double>::operator()
                     (in_RDI,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  *pdVar2 = dVar3;
  pdVar2 = XZ((TPZTensor<double> *)0x14ab010);
  dVar3 = *pdVar2;
  pdVar2 = TPZFMatrix<double>::operator()
                     (in_RDI,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  *pdVar2 = dVar3;
  pdVar2 = TPZFMatrix<double>::operator()
                     (in_RDI,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  *pdVar2 = dVar3;
  pdVar2 = YY((TPZTensor<double> *)0x14ab05e);
  dVar3 = *pdVar2;
  pdVar2 = TPZFMatrix<double>::operator()(in_RDI,in_stack_ffffffffffffffd8,(int64_t)dVar3);
  *pdVar2 = dVar3;
  pdVar2 = YZ((TPZTensor<double> *)0x14ab08e);
  row = *pdVar2;
  pdVar2 = TPZFMatrix<double>::operator()(in_RDI,(int64_t)row,(int64_t)dVar3);
  *pdVar2 = row;
  pdVar2 = TPZFMatrix<double>::operator()(in_RDI,(int64_t)row,(int64_t)dVar3);
  *pdVar2 = row;
  pdVar2 = ZZ((TPZTensor<double> *)0x14ab0de);
  dVar1 = *pdVar2;
  pdVar2 = TPZFMatrix<double>::operator()(in_RDI,(int64_t)row,(int64_t)dVar3);
  *pdVar2 = dVar1;
  return;
}

Assistant:

void TPZTensor<T>::CopyToTensor(TPZFMatrix<T> & Tensor) const {
    Tensor.Resize(3, 3);
    Tensor(0, 0) = XX();
    Tensor(0, 1) = Tensor(1, 0) = XY();
    Tensor(0, 2) = Tensor(2, 0) = XZ();
    Tensor(1, 1) = YY();
    Tensor(1, 2) = Tensor(2, 1) = YZ();
    Tensor(2, 2) = ZZ();
}